

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# git-identity.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  char cVar1;
  __type _Var2;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  size_type sVar6;
  reference pvVar7;
  reference pvVar8;
  string *psVar9;
  reference pbVar10;
  size_t i_1;
  size_type sVar11;
  ulong uVar12;
  size_t i;
  long lVar13;
  unique_ptr<unsigned_long,_std::default_delete<unsigned_long>_> choice;
  ulong local_488;
  ulong local_480;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gitEmail;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  gitName;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  json;
  string choiceStr;
  string email;
  string key;
  value_type identity;
  string value;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  undefined1 local_338 [16];
  string homepath;
  _Any_data local_308;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
  __end2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  ifstream jsonFile;
  
  std::__cxx11::string::string
            ((string *)&jsonFile,"config --local user.name",(allocator *)&__begin2);
  git((string *)&gitName);
  std::__cxx11::string::~string((string *)&jsonFile);
  std::__cxx11::string::string
            ((string *)&jsonFile,"config --local user.email",(allocator *)&__begin2);
  git((string *)&gitEmail);
  std::__cxx11::string::~string((string *)&jsonFile);
  if ((argc < 2) || (iVar4 = strcmp(argv[1],"check"), iVar4 != 0)) {
    pcVar5 = getenv("HOME");
    std::__cxx11::string::string((string *)&homepath,pcVar5,(allocator *)&jsonFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end2,
                   &homepath,"/");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__begin2,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__end2,
                   "git-identity.json");
    std::ifstream::ifstream(&jsonFile,(string *)&__begin2,_S_in);
    std::__cxx11::string::~string((string *)&__begin2);
    std::__cxx11::string::~string((string *)&__end2);
    cVar1 = std::__basic_file<char>::is_open();
    if (cVar1 == '\0') {
      fprintf(_stderr,"Failed to open \'%s\'!\n","git-identity.json");
    }
    else {
      nlohmann::detail::input_adapter::input_adapter
                ((input_adapter *)&__begin2,(istream *)&jsonFile);
      local_2f8 = 0;
      uStack_2f0 = 0;
      local_308._M_unused._M_object = (void *)0x0;
      local_308._8_8_ = 0;
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::parse(&json,(input_adapter *)&__begin2,(parser_callback_t *)&local_308,true);
      std::_Function_base::~_Function_base((_Function_base *)&local_308);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&__begin2.anchor.m_it);
      local_480 = 0;
      local_488 = 0;
      while( true ) {
        sVar6 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::size(&json);
        if (sVar6 <= local_488) break;
        pvVar7 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](&json,local_488);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar7,"user.name");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&choiceStr,pvVar8);
        pvVar8 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)pvVar7,"user.email");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&email,pvVar8);
        if ((((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gitName._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) &&
            ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )gitEmail._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl !=
             (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )0x0)) &&
           (_Var2 = std::operator==(&choiceStr,
                                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)gitName._M_t.
                                       super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       .
                                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                       ._M_head_impl), _Var2)) {
          _Var2 = std::operator==(&email,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)gitEmail._M_t.
                                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            .
                                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                            ._M_head_impl);
          if (_Var2) {
            local_480 = local_488 + 1;
          }
        }
        local_488 = local_488 + 1;
        printf("(%zu) %s <%s>\n",local_488,choiceStr._M_dataplus._M_p,email._M_dataplus._M_p);
        local_358._M_dataplus._M_p = (pointer)pvVar7;
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::begin(&__begin2,
                (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 *)&local_358);
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::end(&__end2,(iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)&local_358);
        while (bVar3 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator!=(&__begin2.anchor,&__end2.anchor), bVar3) {
          psVar9 = nlohmann::detail::
                   iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ::key(&__begin2);
          std::__cxx11::string::string((string *)&key,(string *)psVar9);
          bVar3 = std::operator==(&key,"user.name");
          if ((!bVar3) && (bVar3 = std::operator==(&key,"user.email"), !bVar3)) {
            pbVar10 = nlohmann::detail::
                      iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                      ::operator*(&__begin2.anchor);
            nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
            ::
            get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      (&value,pbVar10);
            printf("    %s",key._M_dataplus._M_p);
            for (lVar13 = 0; key._M_string_length + lVar13 < 0x14; lVar13 = lVar13 + 1) {
              putchar(0x20);
            }
            pcVar5 = "<empty>";
            if (value._M_string_length != 0) {
              pcVar5 = value._M_dataplus._M_p;
            }
            puts(pcVar5);
            std::__cxx11::string::~string((string *)&value);
          }
          std::__cxx11::string::~string((string *)&key);
          nlohmann::detail::
          iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::operator++(&__begin2);
        }
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~iteration_proxy_value(&__end2);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~iteration_proxy_value(&__begin2);
        std::__cxx11::string::~string((string *)&email);
        std::__cxx11::string::~string((string *)&choiceStr);
      }
      if (local_480 == 0) {
        printf("\nYour choice: ");
      }
      else {
        printf("\nYour choice (%zu): ");
      }
      choiceStr._M_dataplus._M_p = (pointer)&choiceStr.field_2;
      choiceStr._M_string_length = 0;
      choiceStr.field_2._M_local_buf[0] = '\0';
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&choiceStr);
      if ((choiceStr._M_string_length == 0) && (local_480 != 0)) {
        choice._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long>,_true,_true>)
             operator_new(8);
        *(ulong *)choice._M_t.
                  super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>._M_t.
                  super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>.
                  super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = local_480;
LAB_00103a54:
        sVar6 = nlohmann::
                basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                ::size(&json);
        if (sVar6 < local_480) goto LAB_00103c56;
        pvVar7 = nlohmann::
                 basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 ::operator[](&json,*(long *)choice._M_t.
                                             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>
                                             .super__Head_base<0UL,_unsigned_long_*,_false>.
                                             _M_head_impl - 1);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::basic_json(&identity,pvVar7);
        local_338._8_8_ = &identity;
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::begin(&__begin2,
                (iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                 *)(local_338 + 8));
        nlohmann::detail::
        iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::end(&__end2,(iteration_proxy<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                       *)(local_338 + 8));
        while (bVar3 = nlohmann::detail::
                       iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                       ::operator!=(&__begin2.anchor,&__end2.anchor), bVar3) {
          psVar9 = nlohmann::detail::
                   iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
                   ::key(&__begin2);
          std::__cxx11::string::string((string *)&email,(string *)psVar9);
          pbVar10 = nlohmann::detail::
                    iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
                    ::operator*(&__begin2.anchor);
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          ::
          get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&key,pbVar10);
          std::operator+(&local_278,"config \"",&email);
          std::operator+(&local_258,&local_278,"\" \"");
          std::operator+(&local_358,&local_258,&key);
          std::operator+(&value,&local_358,"\"");
          git((string *)local_338);
          std::
          unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_338);
          std::__cxx11::string::~string((string *)&value);
          std::__cxx11::string::~string((string *)&local_358);
          std::__cxx11::string::~string((string *)&local_258);
          std::__cxx11::string::~string((string *)&local_278);
          std::__cxx11::string::~string((string *)&key);
          std::__cxx11::string::~string((string *)&email);
          nlohmann::detail::
          iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
          ::operator++(&__begin2);
        }
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~iteration_proxy_value(&__end2);
        nlohmann::detail::
        iteration_proxy_value<nlohmann::detail::iter_impl<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
        ::~iteration_proxy_value(&__begin2);
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::~basic_json(&identity);
      }
      else {
        if (choiceStr._M_string_length != 0) {
          sVar11 = 0;
          local_480 = 0;
          do {
            if (choiceStr._M_string_length == sVar11) {
              choice._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>.
              _M_t.super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>.
              super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                   (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long>,_true,_true>)
                   operator_new(8);
              *(ulong *)choice._M_t.
                        super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>
                        .super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl = local_480;
              if (local_480 == 0) goto LAB_00103c56;
              goto LAB_00103a54;
            }
            if (9 < (int)choiceStr._M_dataplus._M_p[sVar11] - 0x30U) break;
            uVar12 = (ulong)((int)choiceStr._M_dataplus._M_p[sVar11] - 0x30U) + local_480 * 10;
            sVar11 = sVar11 + 1;
            bVar3 = local_480 <= uVar12;
            local_480 = uVar12;
          } while (bVar3);
        }
        choice._M_t.super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>._M_t.
        super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long>_>.
        super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (__uniq_ptr_data<unsigned_long,_std::default_delete<unsigned_long>,_true,_true>)
             (__uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long>_>)0x0;
LAB_00103c56:
        fprintf(_stderr,"Invalid choice \'%s\'!\n",choiceStr._M_dataplus._M_p);
      }
      std::unique_ptr<unsigned_long,_std::default_delete<unsigned_long>_>::~unique_ptr(&choice);
      std::__cxx11::string::~string((string *)&choiceStr);
      nlohmann::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      ::~basic_json(&json);
    }
    std::ifstream::~ifstream(&jsonFile);
    std::__cxx11::string::~string((string *)&homepath);
  }
  else {
    if (((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )gitName._M_t.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl !=
         (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0) &&
       ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gitEmail._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0)) {
      iVar4 = 0;
      fprintf(_stderr,"%s <%s>\n",
              *(undefined8 *)
               gitName._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,
              *(undefined8 *)
               gitEmail._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
      goto LAB_00103c2e;
    }
    fwrite("Name or email not set!\n",0x17,1,_stderr);
  }
  iVar4 = 1;
LAB_00103c2e:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gitEmail);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gitName);
  return iVar4;
}

Assistant:

int main(int argc, char* argv[])
{
	auto gitName = git("config --local user.name");
	auto gitEmail = git("config --local user.email");

	if(argc > 1 && strcmp(argv[1], "check") == 0)
	{
		if(gitName && gitEmail)
		{
			fprintf(stderr, "%s <%s>\n", gitName->c_str(), gitEmail->c_str());
			return EXIT_SUCCESS;
		}
		else
		{
			fprintf(stderr, "Name or email not set!\n");
			return EXIT_FAILURE;
		}
	}

	std::string homepath = getenv("HOME");
	auto jsonFilename = "git-identity.json";
	std::ifstream jsonFile(homepath + "/" + jsonFilename);
	if(!jsonFile.is_open())
	{
		fprintf(stderr, "Failed to open '%s'!\n", jsonFilename);
		return EXIT_FAILURE;
	}

	auto json = nlohmann::json::parse(jsonFile);

	size_t defaultChoice = 0;
	for(size_t i = 0; i < json.size(); i++)
	{
		auto& identity = json[i];
		std::string name = identity["user.name"];
		std::string email = identity["user.email"];
		if(gitName && gitEmail && name == *gitName && email == *gitEmail)
			defaultChoice = i + 1;
		printf("(%zu) %s <%s>\n", i + 1, name.c_str(), email.c_str());
		for(auto& el : identity.items())
		{
			std::string key = el.key();
			if(key == "user.name" || key == "user.email")
				continue;
			std::string value = el.value();
			printf("    %s", key.c_str());
			for(size_t i = 0; i + key.length() < 20; i++)
				printf(" ");
			printf("%s\n", value.empty() ? "<empty>" : value.c_str());
		}
	}

	if(defaultChoice)
		printf("\nYour choice (%zu): ", defaultChoice);
	else
		printf("\nYour choice: ");

	std::string choiceStr;
	std::getline(std::cin, choiceStr);

	auto choice = (choiceStr.empty() && defaultChoice > 0) ? std::make_unique<size_t>(defaultChoice) : parseSize(choiceStr);
	if(!choice || *choice == 0 || *choice > json.size())
	{
		fprintf(stderr, "Invalid choice '%s'!\n", choiceStr.c_str());
		return EXIT_FAILURE;
	}

	auto identity = json[*choice - 1];
	for(auto& el : identity.items())
	{
		std::string key = el.key();
		std::string value = el.value();
		git("config \"" + key + "\" \"" + value + "\"");
	}

	return EXIT_FAILURE;
}